

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Bitmask exprSelectUsage(WhereMaskSet *pMaskSet,Select *pS)

{
  Bitmask BVar1;
  ExprList *pEVar2;
  ulong uVar3;
  WhereMaskSet *in_RSI;
  int i;
  SrcList *pSrc;
  Bitmask mask;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  WhereMaskSet *pMaskSet_00;
  Select *pS_00;
  
  pS_00 = (Select *)0x0;
  for (; in_RSI != (WhereMaskSet *)0x0; in_RSI = *(WhereMaskSet **)(in_RSI->ix + 0x12)) {
    pMaskSet_00 = *(WhereMaskSet **)(in_RSI->ix + 8);
    BVar1 = sqlite3WhereExprListUsage(in_RSI,(ExprList *)pS_00);
    pEVar2 = (ExprList *)(BVar1 | (ulong)pS_00);
    BVar1 = sqlite3WhereExprListUsage(in_RSI,pEVar2);
    pEVar2 = (ExprList *)(BVar1 | (ulong)pEVar2);
    BVar1 = sqlite3WhereExprListUsage(in_RSI,pEVar2);
    uVar3 = BVar1 | (ulong)pEVar2;
    BVar1 = sqlite3WhereExprUsage
                      (pMaskSet_00,
                       (Expr *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    uVar3 = BVar1 | uVar3;
    BVar1 = sqlite3WhereExprUsage
                      (pMaskSet_00,
                       (Expr *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    pS_00 = (Select *)(BVar1 | uVar3);
    if (pMaskSet_00 != (WhereMaskSet *)0x0) {
      for (in_stack_ffffffffffffffdc = 0; in_stack_ffffffffffffffdc < pMaskSet_00->bVarSelect;
          in_stack_ffffffffffffffdc = in_stack_ffffffffffffffdc + 1) {
        if ((*(ushort *)((long)pMaskSet_00->ix + (long)in_stack_ffffffffffffffdc * 0x48 + 0x19) >> 2
            & 1) != 0) {
          BVar1 = exprSelectUsage(in_RSI,pS_00);
          pS_00 = (Select *)(BVar1 | (ulong)pS_00);
        }
        if ((*(ushort *)((long)pMaskSet_00->ix + (long)in_stack_ffffffffffffffdc * 0x48 + 0x19) >>
             0xb & 1) == 0) {
          BVar1 = sqlite3WhereExprUsage
                            (pMaskSet_00,
                             (Expr *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
          pS_00 = (Select *)(BVar1 | (ulong)pS_00);
        }
        if ((*(ushort *)((long)pMaskSet_00->ix + (long)in_stack_ffffffffffffffdc * 0x48 + 0x19) >> 3
            & 1) != 0) {
          BVar1 = sqlite3WhereExprListUsage(in_RSI,(ExprList *)pS_00);
          pS_00 = (Select *)(BVar1 | (ulong)pS_00);
        }
      }
    }
  }
  return (Bitmask)pS_00;
}

Assistant:

static Bitmask exprSelectUsage(WhereMaskSet *pMaskSet, Select *pS){
  Bitmask mask = 0;
  while( pS ){
    SrcList *pSrc = pS->pSrc;
    mask |= sqlite3WhereExprListUsage(pMaskSet, pS->pEList);
    mask |= sqlite3WhereExprListUsage(pMaskSet, pS->pGroupBy);
    mask |= sqlite3WhereExprListUsage(pMaskSet, pS->pOrderBy);
    mask |= sqlite3WhereExprUsage(pMaskSet, pS->pWhere);
    mask |= sqlite3WhereExprUsage(pMaskSet, pS->pHaving);
    if( ALWAYS(pSrc!=0) ){
      int i;
      for(i=0; i<pSrc->nSrc; i++){
        if( pSrc->a[i].fg.isSubquery ){
          mask |= exprSelectUsage(pMaskSet, pSrc->a[i].u4.pSubq->pSelect);
        }
        if( pSrc->a[i].fg.isUsing==0 ){
          mask |= sqlite3WhereExprUsage(pMaskSet, pSrc->a[i].u3.pOn);
        }
        if( pSrc->a[i].fg.isTabFunc ){
          mask |= sqlite3WhereExprListUsage(pMaskSet, pSrc->a[i].u1.pFuncArg);
        }
      }
    }
    pS = pS->pPrior;
  }
  return mask;
}